

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::RowScope::addAssignment<std::__cxx11::string>
          (RowScope *this,string *name,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  pointer *pppaVar1;
  pointer pcVar2;
  iterator __position;
  long *plVar3;
  size_type *psVar4;
  int *val;
  int id;
  int local_84;
  string local_80;
  string local_60;
  string local_40;
  
  local_84 = (int)((ulong)((long)(this->atoms).
                                 super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->atoms).
                                super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + 100;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + name->_M_string_length);
  Transformer::toSQLiteValue_abi_cxx11_(&local_80,(Transformer *)&local_84,val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x179254);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  addSimpleAssign(this,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)operator_new(0x10);
  ((abstract_atom *)local_80._M_dataplus._M_p)->_vptr_abstract_atom =
       (_func_int **)&PTR_bindValue_00199728;
  ((abstract_atom *)((long)local_80._M_dataplus._M_p + 8))->_vptr_abstract_atom =
       (_func_int **)atom->val;
  __position._M_current =
       (this->atoms).
       super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->atoms).
      super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<hiberlite::abstract_atom*,std::allocator<hiberlite::abstract_atom*>>::
    _M_realloc_insert<hiberlite::abstract_atom*>
              ((vector<hiberlite::abstract_atom*,std::allocator<hiberlite::abstract_atom*>> *)this,
               __position,(abstract_atom **)&local_80);
  }
  else {
    *__position._M_current = (abstract_atom *)local_80._M_dataplus._M_p;
    pppaVar1 = &(this->atoms).
                super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  return;
}

Assistant:

inline void RowScope::addAssignment(const std::string name, db_atom<C>& atom){
	int id=FirstAtom+static_cast<int>(atoms.size());

	addSimpleAssign(name, "?"+Transformer::toSQLiteValue(id) );

	db_atom<C>* x=new db_atom<C>(atom);
	atoms.push_back(x);
}